

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

void Curl_conninfo_remote(Curl_easy *data,connectdata *conn,curl_socket_t sockfd)

{
  uint uVar1;
  _Bool _Var2;
  int iVar3;
  uint *puVar4;
  char *pcVar5;
  int *piVar6;
  int local_1b0;
  int error;
  int port;
  curl_socklen_t plen;
  Curl_sockaddr_storage ssrem;
  char buffer [256];
  curl_socket_t sockfd_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  error = 0x80;
  memset(&port,0,0x80);
  iVar3 = getpeername(sockfd,(sockaddr *)&port,(socklen_t *)&error);
  if (iVar3 == 0) {
    _Var2 = Curl_addr2string((sockaddr *)&port,error,conn->primary_ip,&local_1b0);
    if (!_Var2) {
      puVar4 = (uint *)__errno_location();
      uVar1 = *puVar4;
      piVar6 = __errno_location();
      pcVar5 = Curl_strerror(*piVar6,(char *)&ssrem.buffer.sa_stor.__ss_align,0x100);
      Curl_failf(data,"ssrem inet_ntop() failed with errno %d: %s",(ulong)uVar1,pcVar5);
    }
  }
  else {
    puVar4 = (uint *)__errno_location();
    uVar1 = *puVar4;
    pcVar5 = Curl_strerror(uVar1,(char *)&ssrem.buffer.sa_stor.__ss_align,0x100);
    Curl_failf(data,"getpeername() failed with errno %d: %s",(ulong)uVar1,pcVar5);
  }
  return;
}

Assistant:

void Curl_conninfo_remote(struct Curl_easy *data,
                          struct connectdata *conn, curl_socket_t sockfd)
{
#ifdef HAVE_GETPEERNAME
  char buffer[STRERROR_LEN];
  struct Curl_sockaddr_storage ssrem;
  curl_socklen_t plen;
  int port;
  plen = sizeof(struct Curl_sockaddr_storage);
  memset(&ssrem, 0, sizeof(ssrem));
  if(getpeername(sockfd, (struct sockaddr*) &ssrem, &plen)) {
    int error = SOCKERRNO;
    failf(data, "getpeername() failed with errno %d: %s",
          error, Curl_strerror(error, buffer, sizeof(buffer)));
    return;
  }
  if(!Curl_addr2string((struct sockaddr*)&ssrem, plen,
                       conn->primary_ip, &port)) {
    failf(data, "ssrem inet_ntop() failed with errno %d: %s",
          errno, Curl_strerror(errno, buffer, sizeof(buffer)));
    return;
  }
#else
  (void)data;
  (void)conn;
  (void)sockfd;
#endif
}